

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O1

void Mio_LibraryShortNames(Mio_Library_t *pLib)

{
  bool bVar1;
  uint uVar2;
  Mio_Gate_t *pCell;
  size_t sVar3;
  char *pcVar4;
  Mio_Pin_t *pPin;
  uint uVar5;
  byte bVar6;
  char Buffer [10000];
  ushort local_2748 [5004];
  
  uVar2 = Mio_LibraryReadGateNum(pLib);
  uVar5 = uVar2;
  if (1 < uVar2) {
    uVar5 = 0;
    uVar2 = uVar2 - 1;
    if (uVar2 != 0) {
      do {
        uVar5 = uVar5 + 1;
        bVar1 = 9 < uVar2;
        uVar2 = uVar2 / 10;
      } while (bVar1);
    }
  }
  pCell = Mio_LibraryReadGates(pLib);
  if (pCell != (Mio_Gate_t *)0x0) {
    uVar2 = 0;
    do {
      if (pCell->pName != (char *)0x0) {
        free(pCell->pName);
        pCell->pName = (char *)0x0;
      }
      uVar2 = uVar2 + 1;
      sprintf((char *)local_2748,"g%0*d",(ulong)uVar5,(ulong)uVar2);
      sVar3 = strlen((char *)local_2748);
      pcVar4 = (char *)malloc(sVar3 + 1);
      strcpy(pcVar4,(char *)local_2748);
      pCell->pName = pcVar4;
      Mio_LibraryShortFormula(pCell,pCell->pForm,(char *)local_2748);
      if (pCell->pForm != (char *)0x0) {
        free(pCell->pForm);
        pCell->pForm = (char *)0x0;
      }
      sVar3 = strlen((char *)local_2748);
      pcVar4 = (char *)malloc(sVar3 + 1);
      strcpy(pcVar4,(char *)local_2748);
      pCell->pForm = pcVar4;
      pPin = Mio_GateReadPins(pCell);
      if (pPin != (Mio_Pin_t *)0x0) {
        bVar6 = 0x61;
        do {
          if (pPin->pName != (char *)0x0) {
            free(pPin->pName);
            pPin->pName = (char *)0x0;
          }
          local_2748[0] = (ushort)bVar6;
          sVar3 = strlen((char *)local_2748);
          pcVar4 = (char *)malloc(sVar3 + 1);
          strcpy(pcVar4,(char *)local_2748);
          pPin->pName = pcVar4;
          pPin = Mio_PinReadNext(pPin);
          bVar6 = bVar6 + 1;
        } while (pPin != (Mio_Pin_t *)0x0);
      }
      if (pCell->pOutName != (char *)0x0) {
        free(pCell->pOutName);
        pCell->pOutName = (char *)0x0;
      }
      local_2748[0] = 0x7a;
      sVar3 = strlen((char *)local_2748);
      pcVar4 = (char *)malloc(sVar3 + 1);
      strcpy(pcVar4,(char *)local_2748);
      pCell->pOutName = pcVar4;
      pCell = Mio_GateReadNext(pCell);
    } while (pCell != (Mio_Gate_t *)0x0);
  }
  Mio_LibraryHashGates(pLib);
  pcVar4 = pLib->pName;
  uVar5 = Mio_LibraryReadGateNum(pLib);
  printf("Renaming library \"%s\" into \"%s%d\".\n",pcVar4,"lib",(ulong)uVar5);
  if (pLib->pName != (char *)0x0) {
    free(pLib->pName);
    pLib->pName = (char *)0x0;
  }
  uVar5 = Mio_LibraryReadGateNum(pLib);
  sprintf((char *)local_2748,"lib%d",(ulong)uVar5);
  sVar3 = strlen((char *)local_2748);
  pcVar4 = (char *)malloc(sVar3 + 1);
  strcpy(pcVar4,(char *)local_2748);
  pLib->pName = pcVar4;
  return;
}

Assistant:

void Mio_LibraryShortNames( Mio_Library_t * pLib )
{
    char Buffer[10000];
    Mio_Gate_t * pGate; Mio_Pin_t * pPin;
    int c = 0, i, nDigits = Abc_Base10Log( Mio_LibraryReadGateNum(pLib) );
    // itereate through classes
    Mio_LibraryForEachGate( pLib, pGate )
    {
        ABC_FREE( pGate->pName );
        sprintf( Buffer, "g%0*d", nDigits, ++c );
        pGate->pName = Abc_UtilStrsav( Buffer );
        // update formula
        Mio_LibraryShortFormula( pGate, pGate->pForm, Buffer );
        ABC_FREE( pGate->pForm );
        pGate->pForm = Abc_UtilStrsav( Buffer );
        // pin names
        i = 0;
        Mio_GateForEachPin( pGate, pPin )
        {
            ABC_FREE( pPin->pName );
            sprintf( Buffer, "%c", 'a'+i );
            pPin->pName = Abc_UtilStrsav( Buffer );
            i++;
        }
        // output pin
        ABC_FREE( pGate->pOutName );
        sprintf( Buffer, "z" );
        pGate->pOutName = Abc_UtilStrsav( Buffer );
    }
    Mio_LibraryHashGates( pLib );
    // update library name
    printf( "Renaming library \"%s\" into \"%s%d\".\n", pLib->pName, "lib", Mio_LibraryReadGateNum(pLib) );
    ABC_FREE( pLib->pName );
    sprintf( Buffer, "lib%d", Mio_LibraryReadGateNum(pLib) );
    pLib->pName = Abc_UtilStrsav( Buffer );
}